

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O0

Action __thiscall
psy::C::TypeChecker::visitBinaryExpression_Addition<psy::C::AssignmentExpressionSyntax>
          (TypeChecker *this,AssignmentExpressionSyntax *node,Type *leftTy,Type *rightTy)

{
  bool bVar1;
  TypeKind TVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Type *pTVar5;
  SyntaxToken local_68;
  Type *local_30;
  Type *rightTy_local;
  Type *leftTy_local;
  AssignmentExpressionSyntax *node_local;
  TypeChecker *this_local;
  
  local_30 = rightTy;
  rightTy_local = leftTy;
  leftTy_local = (Type *)node;
  node_local = (AssignmentExpressionSyntax *)this;
  bVar1 = isArithmeticType(leftTy);
  if ((bVar1) && (bVar1 = isArithmeticType(local_30), bVar1)) {
    iVar3 = (*rightTy_local->_vptr_Type[5])();
    iVar4 = (*local_30->_vptr_Type[5])();
    pTVar5 = &determineCommonRealType
                        (this,(BasicType *)CONCAT44(extraout_var,iVar3),
                         (BasicType *)CONCAT44(extraout_var_00,iVar4))->super_Type;
    this->ty_ = pTVar5;
  }
  else {
    TVar2 = Type::kind(rightTy_local);
    if ((TVar2 == Pointer) && (bVar1 = isIntegerType(local_30), bVar1)) {
      this->ty_ = rightTy_local;
    }
    else {
      TVar2 = Type::kind(local_30);
      if ((TVar2 != Pointer) || (bVar1 = isIntegerType(rightTy_local), !bVar1)) {
        AssignmentExpressionSyntax::operatorToken
                  (&local_68,(AssignmentExpressionSyntax *)leftTy_local);
        DiagnosticsReporter::InvalidOperator(&this->diagReporter_,&local_68);
        SyntaxToken::~SyntaxToken(&local_68);
        return Quit;
      }
      this->ty_ = local_30;
    }
  }
  return Skip;
}

Assistant:

SyntaxVisitor::Action TypeChecker::visitBinaryExpression_Addition(
        const BinaryLikeExprNodeT* node,
        const Type* leftTy,
        const Type* rightTy)
{
    if (isArithmeticType(leftTy) && isArithmeticType(rightTy)) {
        ty_ = determineCommonRealType(leftTy->asBasicType(), rightTy->asBasicType());
    } else if (leftTy->kind() == TypeKind::Pointer
               && isIntegerType(rightTy)) {
        ty_ = leftTy;
    } else if (rightTy->kind() == TypeKind::Pointer
                && isIntegerType(leftTy)) {
        ty_ = rightTy;
    } else {
        diagReporter_.InvalidOperator(node->operatorToken());
        return Action::Quit;
    }

    return Action::Skip;
}